

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateReader::GetStringToken
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateReader *this,Index string_index)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  Token local_220;
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  Index s_idx;
  CrateReader *this_local;
  Index string_index_local;
  
  sVar1 = ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::size
                    (&this->_string_indices);
  if (string_index.value < sVar1) {
    pvVar2 = ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
             operator[](&this->_string_indices,(ulong)string_index.value);
    GetToken(__return_storage_ptr__,this,(Index)pvVar2->value);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetStringToken");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x9e);
    ::std::operator<<(poVar3," ");
    ::std::__cxx11::to_string(&local_1e0,string_index.value);
    ::std::operator+((char *)local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "String index out of range: ");
    poVar3 = ::std::operator<<((ostream *)local_1a0,local_1c0);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string(local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    Token::Token(&local_220);
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
              (__return_storage_ptr__,&local_220);
    Token::~Token(&local_220);
  }
  return __return_storage_ptr__;
}

Assistant:

const nonstd::optional<value::token> CrateReader::GetStringToken(
    crate::Index string_index) const {

  if (string_index.value < _string_indices.size()) {
    crate::Index s_idx = _string_indices[string_index.value];
    return GetToken(s_idx);
  } else {
    PUSH_ERROR("String index out of range: " +
               std::to_string(string_index.value));
    return value::token();
  }
}